

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

XmlWriter * __thiscall
Catch::XmlWriter::writeAttribute<unsigned_int,void>(XmlWriter *this,StringRef name,uint *attribute)

{
  StringRef name_00;
  XmlWriter *pXVar1;
  string local_88;
  StringRef local_68;
  char *local_58;
  size_type sStack_50;
  undefined1 local_38 [8];
  ReusableStringStream rss;
  uint *attribute_local;
  XmlWriter *this_local;
  StringRef name_local;
  
  rss.m_oss = (ostream *)attribute;
  ReusableStringStream::ReusableStringStream((ReusableStringStream *)local_38);
  ReusableStringStream::operator<<((ReusableStringStream *)local_38,(uint *)rss.m_oss);
  local_58 = name.m_start;
  sStack_50 = name.m_size;
  ReusableStringStream::str_abi_cxx11_(&local_88,(ReusableStringStream *)local_38);
  StringRef::StringRef(&local_68,&local_88);
  name_00.m_size = sStack_50;
  name_00.m_start = local_58;
  pXVar1 = writeAttribute(this,name_00,local_68);
  std::__cxx11::string::~string((string *)&local_88);
  ReusableStringStream::~ReusableStringStream((ReusableStringStream *)local_38);
  return pXVar1;
}

Assistant:

XmlWriter& writeAttribute( StringRef name, T const& attribute ) {
            ReusableStringStream rss;
            rss << attribute;
            return writeAttribute( name, rss.str() );
        }